

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O0

void __thiscall Storage::Disk::Drive::set_head(Drive *this,int head)

{
  int *piVar1;
  shared_ptr<Storage::Disk::Track> local_28;
  int local_18;
  int local_14;
  Drive *pDStack_10;
  int head_local;
  Drive *this_local;
  
  local_18 = this->available_heads_ + -1;
  local_14 = head;
  pDStack_10 = this;
  piVar1 = std::min<int>(&local_14,&local_18);
  local_14 = *piVar1;
  if (local_14 != this->head_) {
    this->head_ = local_14;
    std::shared_ptr<Storage::Disk::Track>::shared_ptr(&local_28,(nullptr_t)0x0);
    std::shared_ptr<Storage::Disk::Track>::operator=(&this->track_,&local_28);
    std::shared_ptr<Storage::Disk::Track>::~shared_ptr(&local_28);
  }
  return;
}

Assistant:

void Drive::set_head(int head) {
	head = std::min(head, available_heads_ - 1);
	if(head != head_) {
		head_ = head;
		track_ = nullptr;
	}
}